

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

void diag(char *s1,char *s2)

{
  char *pcVar1;
  int __c;
  
  fputs(s1,_stderr);
  if (s2 != (char *)0x0) {
    fputs(s2,_stderr);
  }
  if (fin != (FILE *)0x0) {
    fprintf(_stderr," at line %d in file %s\n",(ulong)(uint)linenum,finname);
    fputs(inlinep,_stderr);
    if (inlinep <= ctp) {
      pcVar1 = inlinep;
      if (inlinep < ctp + -1) {
        do {
          __c = 0x20;
          if (*pcVar1 == '\t') {
            __c = 9;
          }
          fputc(__c,_stderr);
          pcVar1 = pcVar1 + 1;
        } while (pcVar1 < ctp + -1);
      }
      fputc(0x5e,_stderr);
    }
  }
  fputc(10,_stderr);
  exit(1);
}

Assistant:

void diag(s1, s2)
	char           *s1, *s2;
{
	char           *cp;
	Fprintf(stderr, "%s", s1);
	if (s2) {
		Fprintf(stderr, "%s", s2);
	}
	if (fin) {
		Fprintf(stderr, " at line %d in file %s\n", linenum, finname);
		Fprintf(stderr, "%s", inlinep);
		if (ctp >= inlinep) {
			for (cp = inlinep; cp < ctp - 1; cp++) {
				if (*cp == '\t') {
					Fprintf(stderr, "\t");
				} else {
					Fprintf(stderr, " ");
				}
			}
			Fprintf(stderr, "^");
		}
	}
	Fprintf(stderr, "\n");
#if MAC && TARGET_API_MAC_CARBON
	SIOUXSettings.autocloseonquit = true;
	RunApplicationEventLoop();
#endif
	exit(1);
}